

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyDfs.c
# Opt level: O0

int Ivy_ManSetLevels_rec(Ivy_Obj_t *pObj,int fHaig)

{
  int iVar1;
  Ivy_Obj_t *pIVar2;
  uint local_30;
  uint local_2c;
  Ivy_Obj_t *pIStack_28;
  uint LevelMax;
  Ivy_Obj_t *pTemp;
  int fHaig_local;
  Ivy_Obj_t *pObj_local;
  
  iVar1 = Ivy_ObjIsMarkA(pObj);
  if (iVar1 == 0) {
    Ivy_ObjSetMarkA(pObj);
    iVar1 = Ivy_ObjIsConst1(pObj);
    if ((iVar1 == 0) && (iVar1 = Ivy_ObjIsCi(pObj), iVar1 == 0)) {
      iVar1 = Ivy_ObjIsBuf(pObj);
      if ((iVar1 == 0) &&
         ((iVar1 = Ivy_ObjIsAnd(pObj), iVar1 == 0 && (iVar1 = Ivy_ObjIsExor(pObj), iVar1 == 0)))) {
        __assert_fail("Ivy_ObjIsBuf(pObj) || Ivy_ObjIsAnd(pObj) || Ivy_ObjIsExor(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyDfs.c"
                      ,0x1a1,"int Ivy_ManSetLevels_rec(Ivy_Obj_t *, int)");
      }
      pIVar2 = Ivy_ObjFanin0(pObj);
      Ivy_ManSetLevels_rec(pIVar2,fHaig);
      iVar1 = Ivy_ObjIsBuf(pObj);
      if (iVar1 == 0) {
        pIVar2 = Ivy_ObjFanin1(pObj);
        Ivy_ManSetLevels_rec(pIVar2,fHaig);
      }
      iVar1 = Ivy_ObjIsBuf(pObj);
      if (iVar1 == 0) {
        iVar1 = Ivy_ObjIsNode(pObj);
        if (iVar1 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyDfs.c"
                        ,0x1ab,"int Ivy_ManSetLevels_rec(Ivy_Obj_t *, int)");
        }
        iVar1 = Ivy_ObjLevelNew(pObj);
        *(uint *)&pObj->field_0x8 = *(uint *)&pObj->field_0x8 & 0x7ff | iVar1 << 0xb;
      }
      else {
        pIVar2 = Ivy_ObjFanin0(pObj);
        *(uint *)&pObj->field_0x8 =
             *(uint *)&pObj->field_0x8 & 0x7ff | ((*(uint *)&pIVar2->field_0x8 >> 0xb) + 1) * 0x800;
      }
      if (((fHaig != 0) && (pObj->pEquiv != (Ivy_Obj_t *)0x0)) &&
         (iVar1 = Ivy_ObjRefs(pObj), 0 < iVar1)) {
        local_2c = *(uint *)&pObj->field_0x8 >> 0xb;
        for (pIStack_28 = pObj->pEquiv; pIStack_28 != pObj;
            pIStack_28 = Ivy_Regular(pIStack_28->pEquiv)) {
          Ivy_ManSetLevels_rec(pIStack_28,fHaig);
          if (*(uint *)&pIStack_28->field_0x8 >> 0xb < local_2c) {
            local_30 = local_2c;
          }
          else {
            local_30 = *(uint *)&pIStack_28->field_0x8 >> 0xb;
          }
          local_2c = local_30;
        }
        *(uint *)&pObj->field_0x8 = *(uint *)&pObj->field_0x8 & 0x7ff | local_2c << 0xb;
        for (pIStack_28 = pObj->pEquiv; pIStack_28 != pObj;
            pIStack_28 = Ivy_Regular(pIStack_28->pEquiv)) {
          *(uint *)&pIStack_28->field_0x8 =
               *(uint *)&pIStack_28->field_0x8 & 0x7ff | local_2c << 0xb;
        }
      }
      pObj_local._4_4_ = *(uint *)&pObj->field_0x8 >> 0xb;
    }
    else {
      pObj_local._4_4_ = 0;
    }
  }
  else {
    pObj_local._4_4_ = *(uint *)&pObj->field_0x8 >> 0xb;
  }
  return pObj_local._4_4_;
}

Assistant:

int Ivy_ManSetLevels_rec( Ivy_Obj_t * pObj, int fHaig )
{
    // quit if the node is visited
    if ( Ivy_ObjIsMarkA(pObj) )
        return pObj->Level;
    Ivy_ObjSetMarkA(pObj);
    // quit if this is a CI
    if ( Ivy_ObjIsConst1(pObj) || Ivy_ObjIsCi(pObj) )
        return 0;
    assert( Ivy_ObjIsBuf(pObj) || Ivy_ObjIsAnd(pObj) || Ivy_ObjIsExor(pObj) );
    // get levels of the fanins
    Ivy_ManSetLevels_rec( Ivy_ObjFanin0(pObj), fHaig );
    if ( !Ivy_ObjIsBuf(pObj) )
        Ivy_ManSetLevels_rec( Ivy_ObjFanin1(pObj), fHaig );
    // get level of the node
    if ( Ivy_ObjIsBuf(pObj) )
        pObj->Level = 1 + Ivy_ObjFanin0(pObj)->Level;
    else if ( Ivy_ObjIsNode(pObj) )
        pObj->Level = Ivy_ObjLevelNew( pObj );
    else assert( 0 );
    // get level of other choices
    if ( fHaig && pObj->pEquiv && Ivy_ObjRefs(pObj) > 0 )
    {
        Ivy_Obj_t * pTemp;
        unsigned LevelMax = pObj->Level;
        for ( pTemp = pObj->pEquiv; pTemp != pObj; pTemp = Ivy_Regular(pTemp->pEquiv) )
        {
            Ivy_ManSetLevels_rec( pTemp, fHaig );
            LevelMax = IVY_MAX( LevelMax, pTemp->Level );
        }
        // get this level
        pObj->Level = LevelMax;
        for ( pTemp = pObj->pEquiv; pTemp != pObj; pTemp = Ivy_Regular(pTemp->pEquiv) )
            pTemp->Level = LevelMax;
    }
    return pObj->Level;
}